

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O0

void __thiscall
burst::dynamic_tuple::push_back<(anonymous_namespace)::dummy>(dynamic_tuple *this,dummy *object)

{
  int8_t *creation_place_00;
  int8_t *creation_place;
  dummy *object_local;
  dynamic_tuple *this_local;
  
  creation_place_00 = set_up_creation_place<(anonymous_namespace)::dummy>(this,object);
  accomodate<(anonymous_namespace)::dummy>(this,object,creation_place_00);
  return;
}

Assistant:

void push_back (T && object)
        {
            auto creation_place = set_up_creation_place(object);
            accomodate(std::forward<T>(object), creation_place);
        }